

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getRotationalKinetic(Thermo *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  SnapshotManager *this_00;
  double *pdVar8;
  undefined8 *in_RDI;
  double dVar9;
  RealType RVar10;
  RealType kinetic;
  int k;
  int j;
  int i;
  Mat3x3d I;
  Vector3d angMom;
  StuntDouble *sd;
  Molecule *mol;
  iterator iiter;
  MoleculeIterator miter;
  Snapshot *snap;
  SquareMatrix3<double> *in_stack_fffffffffffffdc8;
  Molecule *in_stack_fffffffffffffdd0;
  StuntDouble *in_stack_fffffffffffffdd8;
  iterator *in_stack_fffffffffffffde8;
  SimInfo *in_stack_fffffffffffffdf0;
  undefined1 local_118 [112];
  double local_a8;
  uint local_9c;
  uint local_98;
  int local_94;
  RectMatrix<double,_3U,_3U> local_90;
  Vector<double,_3U> local_48;
  StuntDouble *local_30;
  Molecule *local_28;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  Snapshot *local_10;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_10->hasRotationalKineticEnergy & 1U) == 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
    __gnu_cxx::
    __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
    ::__normal_iterator(&local_20);
    Vector3<double>::Vector3((Vector3<double> *)0x16f23b);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x16f248);
    local_a8 = 0.0;
    local_28 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffdf0,(MoleculeIterator *)in_stack_fffffffffffffde8);
    while (local_28 != (Molecule *)0x0) {
      local_30 = Molecule::beginIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      while (local_30 != (StuntDouble *)0x0) {
        bVar7 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffdd0);
        if (bVar7) {
          StuntDouble::getJ(in_stack_fffffffffffffdd8);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffdd0,
                     (Vector3<double> *)in_stack_fffffffffffffdc8);
          (*local_30->_vptr_StuntDouble[5])(local_118);
          SquareMatrix3<double>::operator=
                    ((SquareMatrix3<double> *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16f366);
          bVar7 = StuntDouble::isLinear(local_30);
          if (bVar7) {
            local_94 = StuntDouble::linearAxis(local_30);
            local_98 = local_94 + 1 + ((local_94 + 1) / 3) * -3;
            local_9c = local_94 + 2 + ((local_94 + 2) / 3) * -3;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,local_98);
            dVar1 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,local_98);
            dVar2 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_90,local_98,local_98);
            dVar3 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,local_9c);
            dVar4 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,local_9c);
            dVar5 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_90,local_9c,local_9c);
            local_a8 = (dVar1 * dVar2) / dVar3 + (dVar4 * dVar5) / *pdVar8 + local_a8;
          }
          else {
            pdVar8 = Vector<double,_3U>::operator[](&local_48,0);
            dVar1 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,0);
            dVar2 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_90,0,0);
            dVar3 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,1);
            dVar4 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,1);
            dVar5 = *pdVar8;
            pdVar8 = RectMatrix<double,_3U,_3U>::operator()(&local_90,1,1);
            dVar6 = *pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,2);
            in_stack_fffffffffffffdf0 = (SimInfo *)*pdVar8;
            pdVar8 = Vector<double,_3U>::operator[](&local_48,2);
            dVar9 = (double)in_stack_fffffffffffffdf0 * *pdVar8;
            in_stack_fffffffffffffde8 =
                 (iterator *)RectMatrix<double,_3U,_3U>::operator()(&local_90,2,2);
            local_a8 = (dVar1 * dVar2) / dVar3 + (dVar4 * dVar5) / dVar6 +
                       dVar9 / (double)in_stack_fffffffffffffde8->_M_current + local_a8;
          }
        }
        in_stack_fffffffffffffdd8 =
             Molecule::nextIntegrableObject
                       ((Molecule *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        local_30 = in_stack_fffffffffffffdd8;
      }
      in_stack_fffffffffffffdd0 =
           SimInfo::nextMolecule
                     (in_stack_fffffffffffffdf0,(MoleculeIterator *)in_stack_fffffffffffffde8);
      local_28 = in_stack_fffffffffffffdd0;
    }
    local_a8 = (local_a8 * 0.5) / 0.0004184;
    Snapshot::setRotationalKineticEnergy(local_10,local_a8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16f86a);
  }
  RVar10 = Snapshot::getRotationalKineticEnergy(local_10);
  return RVar10;
}

Assistant:

RealType Thermo::getRotationalKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasRotationalKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<StuntDouble*>::iterator iiter;
      Molecule* mol;
      StuntDouble* sd;
      Vector3d angMom;
      Mat3x3d I;
      int i, j, k;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          if (sd->isDirectional()) {
            angMom = sd->getJ();
            I      = sd->getI();

            if (sd->isLinear()) {
              i = sd->linearAxis();
              j = (i + 1) % 3;
              k = (i + 2) % 3;
              kinetic += angMom[j] * angMom[j] / I(j, j) +
                         angMom[k] * angMom[k] / I(k, k);
            } else {
              kinetic += angMom[0] * angMom[0] / I(0, 0) +
                         angMom[1] * angMom[1] / I(1, 1) +
                         angMom[2] * angMom[2] / I(2, 2);
            }
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic = kinetic * 0.5 / Constants::energyConvert;

      snap->setRotationalKineticEnergy(kinetic);
    }
    return snap->getRotationalKineticEnergy();
  }